

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

GLuint __thiscall gl4cts::EnhancedLayouts::Utils::Type::GetBaseAlignment(Type *this,bool is_array)

{
  uint uVar1;
  GLuint GVar2;
  int iVar3;
  
  uVar1 = this->m_n_rows - 2;
  if (uVar1 < 3) {
    iVar3 = *(int *)(&DAT_01658758 + (ulong)uVar1 * 4);
  }
  else {
    iVar3 = 1;
  }
  GVar2 = GetTypeSize(this->m_basic_type);
  uVar1 = GVar2 * iVar3;
  if ((is_array) || (this->m_n_columns != 1)) {
    iVar3 = 0x10 - (uVar1 & 0xf);
    if ((uVar1 & 0xf) == 0) {
      iVar3 = 0;
    }
    uVar1 = uVar1 + iVar3;
  }
  return uVar1;
}

Assistant:

GLuint Type::GetBaseAlignment(bool is_array) const
{
	GLuint elements = 1;

	switch (m_n_rows)
	{
	case 2:
		elements = 2;
		break;
	case 3:
	case 4:
		elements = 4;
		break;
	default:
		break;
	}

	GLuint N		 = GetTypeSize(m_basic_type);
	GLuint alignment = N * elements;

	if ((true == is_array) || (1 != m_n_columns))
	{
		alignment = align(alignment, 16 /* vec4 alignment */);
	}

	return alignment;
}